

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucurr.cpp
# Opt level: O3

UBool fallback(char *loc)

{
  int iVar1;
  size_t sVar2;
  UErrorCode status;
  UErrorCode local_c;
  
  if (*loc != '\0') {
    local_c = U_ZERO_ERROR;
    iVar1 = strcmp(loc,"en_GB");
    if (iVar1 == 0) {
      builtin_strncpy(loc + 3,"001",4);
    }
    else {
      sVar2 = strlen(loc);
      uloc_getParent_63(loc,loc,(int32_t)sVar2,&local_c);
    }
    return '\x01';
  }
  return '\0';
}

Assistant:

static UBool fallback(char *loc) {
    if (!*loc) {
        return FALSE;
    }
    UErrorCode status = U_ZERO_ERROR;
    if (uprv_strcmp(loc, "en_GB") == 0) {
        // HACK: See #13368.  We need "en_GB" to fall back to "en_001" instead of "en"
        // in order to consume the correct data strings.  This hack will be removed
        // when proper data sink loading is implemented here.
        // NOTE: "001" adds 1 char over "GB".  However, both call sites allocate
        // arrays with length ULOC_FULLNAME_CAPACITY (plenty of room for en_001).
        uprv_strcpy(loc + 3, "001");
    } else {
        uloc_getParent(loc, loc, (int32_t)uprv_strlen(loc), &status);
    }
 /*
    char *i = uprv_strrchr(loc, '_');
    if (i == NULL) {
        i = loc;
    }
    *i = 0;
 */
    return TRUE;
}